

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx.cpp
# Opt level: O0

bool mg::data::mzx_compress(string *raw,string *out,bool invert)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  byte *pbVar4;
  void *__dest;
  void *__src;
  ulong local_70;
  ulong local_58;
  size_type i;
  uint8_t cmd;
  uint8_t words_to_write;
  uint bytes_to_write;
  size_type bytes_remaining;
  size_type pos;
  size_type output_offset;
  size_type output_size;
  undefined4 uStack_1d;
  MzxHeader header;
  bool invert_local;
  string *out_local;
  string *raw_local;
  
  stack0xffffffffffffffdf = 0x30585a4d;
  header.magic[0] = invert;
  unique0x1000015a = out;
  uStack_1d = std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)stack0xffffffffffffffe8);
  MzxHeader::to_file_order((MzxHeader *)((long)&output_size + 7));
  puVar1 = (undefined8 *)std::__cxx11::string::data();
  *puVar1 = CONCAT44(uStack_1d,stack0xffffffffffffffdf);
  pos = 8;
  for (bytes_remaining = 0; uVar2 = std::__cxx11::string::size(), bytes_remaining < uVar2;
      bytes_remaining = (local_70 & 0xffffffff) + bytes_remaining) {
    lVar3 = std::__cxx11::string::size();
    local_70 = lVar3 - bytes_remaining;
    if (0x7f < local_70) {
      local_70 = 0x80;
    }
    i._3_1_ = (char)((uint)local_70 >> 1);
    if ((local_70 & 1) != 0) {
      i._3_1_ = i._3_1_ + '\x01';
    }
    uVar2 = pos + 1;
    pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)stack0xffffffffffffffe8);
    *pbVar4 = (i._3_1_ + -1) * '\x04' | 3;
    __dest = (void *)std::__cxx11::string::operator[]((ulong)stack0xffffffffffffffe8);
    __src = (void *)std::__cxx11::string::operator[]((ulong)raw);
    memcpy(__dest,__src,local_70 & 0xffffffff);
    local_58 = uVar2;
    if ((header.magic[0] & 1) != 0) {
      for (; local_58 < uVar2 + (local_70 & 0xffffffff); local_58 = local_58 + 1) {
        pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)stack0xffffffffffffffe8);
        *pbVar4 = *pbVar4 ^ 0xff;
      }
    }
    pos = (local_70 & 0xffffffff) + uVar2;
  }
  std::__cxx11::string::resize((ulong)stack0xffffffffffffffe8);
  return true;
}

Assistant:

bool mzx_compress(const std::string &raw, std::string &out, bool invert) {
  // Don't bother actually compressing the data for now, just emit a valid
  // stream of literals
  MzxHeader header;
  memcpy(header.magic, MzxHeader::FILE_MAGIC, sizeof(header.magic));
  header.decompressed_size = raw.size();

  // Estimate our final size
  const std::string::size_type output_size =
      sizeof(header) + raw.size() + 2 * ((raw.size() / 128) + 1);
  out.resize(output_size);

  // Write header
  std::string::size_type output_offset = 0;
  header.to_file_order();
  memcpy(out.data(), &header, sizeof(header));
  output_offset += sizeof(header);

  for (std::string::size_type pos = 0; pos < raw.size();) {
    // Len field is 6 bits, each word is 2 bytes, we can write 128 bytes per
    // literal record
    const std::string::size_type bytes_remaining = raw.size() - pos;
    const unsigned bytes_to_write =
        bytes_remaining < 128 ? bytes_remaining : 128;

    // Convert that to a number of words to write.
    // If we have a trailing byte, that needs an extra word.
    uint8_t words_to_write = bytes_to_write / 2;
    if (bytes_to_write & 1) {
      words_to_write++;
    }

    // The number of words to write offset by one in the literal
    words_to_write--;

    // Pack the cmd
    uint8_t cmd = CMD_LITERAL | (words_to_write << 2);
    out[output_offset++] = cmd;

    // Write the next bytes_to_write datums
    memcpy(&out[output_offset], &raw[pos], bytes_to_write);
    if (invert) {
      for (std::string::size_type i = output_offset;
           i < output_offset + bytes_to_write; i++) {
        out[i] ^= 0xFF;
      }
    }
    output_offset += bytes_to_write;

    // Increment pos
    pos += bytes_to_write;
  }

  // Shrink the output size down to the bytes we actually wrote
  out.resize(output_offset);

  return true;
}